

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_array_replace_value(JSON_Array *array,size_t ix,JSON_Value *value)

{
  JSON_Status JVar1;
  
  JVar1 = -1;
  if (((value != (JSON_Value *)0x0 && array != (JSON_Array *)0x0) &&
      (value->parent == (JSON_Value *)0x0)) && (ix < array->count)) {
    json_value_free(array->items[ix]);
    value->parent = array->wrapping_value;
    array->items[ix] = value;
    JVar1 = 0;
  }
  return JVar1;
}

Assistant:

JSON_Status json_array_replace_value(JSON_Array *array, size_t ix, JSON_Value *value) {
    if (array == NULL || value == NULL || value->parent != NULL || ix >= json_array_get_count(array)) {
        return JSONFailure;
    }
    json_value_free(json_array_get_value(array, ix));
    value->parent = json_array_get_wrapping_value(array);
    array->items[ix] = value;
    return JSONSuccess;
}